

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O0

void __thiscall
pbrt::PixelSensor::PixelSensor
          (PixelSensor *this,RGBColorSpace *outputColorSpace,Spectrum *sensorIllum,
          Float imagingRatio,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  Tuple2<pbrt::Point2,_float> in_RCX;
  TaggedPointer *in_RDX;
  SquareMatrix<3> *in_RDI;
  Float in_XMM0_Da;
  Point2f PVar4;
  undefined8 uVar5;
  undefined8 extraout_XMM0_Qb;
  XYZ XVar6;
  Point2f targetWhite;
  Point2f sourceWhite;
  DenselySampledSpectrum *in_stack_fffffffffffffeb8;
  Spectrum *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  DenselySampledSpectrum *in_stack_fffffffffffffed8;
  Allocator in_stack_fffffffffffffee0;
  undefined1 local_c4 [36];
  Spectrum *in_stack_ffffffffffffff60;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffffd0;
  
  SquareMatrix<3>::SquareMatrix(in_RDI);
  Spectra::X();
  Spectrum::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_stack_fffffffffffffed8,
             (Spectrum *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffee0);
  Spectra::Y();
  Spectrum::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_stack_fffffffffffffed8,
             (Spectrum *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffee0);
  Spectra::Z();
  Spectrum::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_stack_fffffffffffffed8,
             (Spectrum *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffee0);
  uVar5 = 0;
  in_RDI[4].m[1][1] = in_XMM0_Da;
  bVar3 = pbrt::TaggedPointer::operator_cast_to_bool(in_RDX);
  if (bVar3) {
    Spectrum::Spectrum(in_stack_fffffffffffffec0,(Spectrum *)in_stack_fffffffffffffeb8);
    XVar6 = SpectrumToXYZ(in_stack_ffffffffffffff60);
    auVar2._8_8_ = uVar5;
    auVar2._0_8_ = XVar6._0_8_;
    vmovlpd_avx(auVar2);
    PVar4 = XYZ::xy((XYZ *)in_stack_fffffffffffffeb8);
    auVar1._8_8_ = extraout_XMM0_Qb;
    auVar1._0_4_ = PVar4.super_Tuple2<pbrt::Point2,_float>.x;
    auVar1._4_4_ = PVar4.super_Tuple2<pbrt::Point2,_float>.y;
    vmovlpd_avx(auVar1);
    WhiteBalance((Point2f)in_stack_ffffffffffffffd0,(Point2f)in_RCX);
    memcpy(in_RDI,local_c4,0x24);
  }
  return;
}

Assistant:

PixelSensor(const RGBColorSpace *outputColorSpace, Spectrum sensorIllum,
                Float imagingRatio, Allocator alloc)
        : r_bar(&Spectra::X(), alloc),
          g_bar(&Spectra::Y(), alloc),
          b_bar(&Spectra::Z(), alloc),
          imagingRatio(imagingRatio) {
        // Compute white balancing matrix for XYZ _PixelSensor_
        if (sensorIllum) {
            Point2f sourceWhite = SpectrumToXYZ(sensorIllum).xy();
            Point2f targetWhite = outputColorSpace->w;
            XYZFromSensorRGB = WhiteBalance(sourceWhite, targetWhite);
        }
    }